

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Long FT_Get_CMap_Format(FT_CharMap charmap)

{
  FT_Driver pFVar1;
  int iVar2;
  undefined8 *local_48;
  FT_Pointer _tmp_;
  FT_Module module;
  TT_CMapInfo cmap_info;
  FT_Face face;
  FT_Service_TTCMaps service;
  FT_CharMap charmap_local;
  
  if ((charmap == (FT_CharMap)0x0) || (charmap->face == (FT_Face)0x0)) {
    charmap_local = (FT_CharMap)0xffffffffffffffff;
  }
  else {
    cmap_info.format = (FT_Long)charmap->face;
    pFVar1 = ((FT_Face)cmap_info.format)->driver;
    local_48 = (undefined8 *)0x0;
    if (((pFVar1->root).clazz)->get_interface != (FT_Module_Requester)0x0) {
      local_48 = (undefined8 *)(*((pFVar1->root).clazz)->get_interface)(&pFVar1->root,"tt-cmaps");
    }
    if (local_48 == (undefined8 *)0x0) {
      charmap_local = (FT_CharMap)0xffffffffffffffff;
    }
    else {
      iVar2 = (*(code *)*local_48)(charmap,&module);
      if (iVar2 == 0) {
        charmap_local = (FT_CharMap)cmap_info.language;
      }
      else {
        charmap_local = (FT_CharMap)0xffffffffffffffff;
      }
    }
  }
  return (FT_Long)charmap_local;
}

Assistant:

FT_EXPORT_DEF( FT_Long )
  FT_Get_CMap_Format( FT_CharMap  charmap )
  {
    FT_Service_TTCMaps  service;
    FT_Face             face;
    TT_CMapInfo         cmap_info;


    if ( !charmap || !charmap->face )
      return -1;

    face = charmap->face;
    FT_FACE_FIND_SERVICE( face, service, TT_CMAP );
    if ( !service )
      return -1;
    if ( service->get_cmap_info( charmap, &cmap_info ))
      return -1;

    return cmap_info.format;
  }